

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inifile.cpp
# Opt level: O3

bool __thiscall utils::IniFile::readFile(IniFile *this,string *filename)

{
  char *pcVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  ulong uVar7;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar8;
  undefined8 uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined1 uVar11;
  _Alloc_hider _Var12;
  undefined1 *puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char *pcVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  char *pcVar18;
  undefined1 *puVar19;
  ulong uVar20;
  char *pcVar21;
  bool bVar22;
  string name;
  string line;
  string value;
  string group;
  wordexp_t exp_res;
  ifstream file;
  key_type local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_418;
  ulong local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  ulong local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  ulong local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  char *local_3b8;
  long local_3b0;
  char local_3a8 [16];
  char *local_398;
  ulong local_390;
  char local_388;
  undefined7 uStack_387;
  undefined8 uStack_380;
  char *local_378;
  long local_370;
  char local_368;
  undefined7 uStack_367;
  undefined8 uStack_360;
  undefined1 *local_358 [2];
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  ulong local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  undefined1 *local_318;
  long local_310;
  undefined1 local_308 [16];
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_2f8;
  key_type local_2f0;
  undefined1 *local_2d0;
  long local_2c8;
  undefined1 local_2c0 [16];
  undefined1 *local_2b0;
  long local_2a8;
  undefined1 local_2a0 [16];
  char *local_290;
  long local_288;
  char local_280 [16];
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  wordexp_t local_250;
  long local_238 [65];
  
  local_2f8 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)this;
  std::ifstream::ifstream(local_238);
  wordexp((filename->_M_dataplus)._M_p,&local_250,0);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)*local_250.we_wordv);
  wordfree(&local_250);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    puVar19 = local_260;
    local_270 = puVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"inifile","");
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_440,local_270,local_270 + local_268);
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
    if (iVar4 != 0) {
      iVar4 = std::__throw_system_error(iVar4);
LAB_00115256:
      iVar4 = std::__throw_system_error(iVar4);
LAB_0011525d:
      uVar9 = std::__throw_system_error(iVar4);
      if (local_2d0 != puVar19) {
        operator_delete(local_2d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p);
      }
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8);
      }
      std::ifstream::~ifstream(local_238);
      _Unwind_Resume(uVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_440._M_dataplus._M_p,local_440._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"unable to open file",0x13);
    pcVar2 = (filename->_M_dataplus)._M_p;
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar2,pcVar2 + filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_290,local_288);
    if (local_290 != local_280) {
      operator_delete(local_290);
    }
    DebugStream::~DebugStream((DebugStream *)&local_3b8);
    if (local_270 != puVar19) {
      operator_delete(local_270);
    }
    uVar11 = 1;
  }
  else {
    local_3b8 = local_3a8;
    local_3b0 = 0;
    local_3a8[0] = '\0';
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    local_2f0._M_string_length = 0;
    local_2f0.field_2._M_local_buf[0] = '\0';
LAB_001140fe:
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3b8,cVar3);
    bVar22 = ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0;
    local_420 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_420._1_7_,bVar22);
    if (!bVar22) {
      lVar6 = std::__cxx11::string::find((char *)&local_3b8,0x117703,0);
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)&local_3d8,(ulong)&local_3b8);
        paVar10 = local_3d8;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3d8->_M_local_buf + local_3d0);
        paVar14 = local_3d8;
        if (0 < (long)local_3d0 >> 2) {
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3d8->_M_local_buf + (local_3d0 & 0xfffffffffffffffc));
          lVar6 = ((long)local_3d0 >> 2) + 1;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3d8->_M_local_buf + 3);
          do {
            iVar4 = isspace((int)paVar17->_M_local_buf[-3]);
            if (iVar4 == 0) {
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar17->_M_local_buf + -3);
              goto LAB_0011424c;
            }
            iVar4 = isspace((int)paVar17->_M_local_buf[-2]);
            if (iVar4 == 0) {
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar17->_M_local_buf + -2);
              goto LAB_0011424c;
            }
            iVar4 = isspace((int)paVar17->_M_local_buf[-1]);
            if (iVar4 == 0) {
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar17->_M_local_buf + -1);
              goto LAB_0011424c;
            }
            iVar4 = isspace((int)paVar17->_M_local_buf[0]);
            if (iVar4 == 0) goto LAB_0011424c;
            lVar6 = lVar6 + -1;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar17->_M_local_buf + 4);
          } while (1 < lVar6);
        }
        lVar6 = (long)paVar15 - (long)paVar14->_M_local_buf;
        if (lVar6 == 1) {
LAB_00114239:
          iVar4 = isspace((int)paVar14->_M_local_buf[0]);
          paVar17 = paVar14;
          if (iVar4 != 0) {
            paVar17 = paVar15;
          }
LAB_0011424c:
          if (paVar15 == paVar17) goto LAB_00114265;
          std::__cxx11::string::_M_erase((ulong)&local_3d8,0);
        }
        else {
          if (lVar6 == 2) {
LAB_0011420f:
            iVar4 = isspace((int)paVar14->_M_local_buf[0]);
            paVar17 = paVar14;
            if (iVar4 != 0) {
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar14->_M_local_buf + 1);
              goto LAB_00114239;
            }
            goto LAB_0011424c;
          }
          if (lVar6 == 3) {
            iVar4 = isspace((int)paVar14->_M_local_buf[0]);
            paVar17 = paVar14;
            if (iVar4 != 0) {
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar14->_M_local_buf + 1);
              goto LAB_0011420f;
            }
            goto LAB_0011424c;
          }
LAB_00114265:
          local_3d0 = 0;
          paVar10->_M_local_buf[0] = '\0';
        }
        paVar15 = local_3d8;
        uVar7 = local_3d0;
        if (0 < (long)local_3d0 >> 2) {
          uVar7 = (ulong)((uint)local_3d0 & 3);
          lVar6 = ((long)local_3d0 >> 2) + 1;
          uVar20 = local_3d0;
          do {
            iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 1]);
            if (iVar4 == 0) {
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar15->_M_local_buf + uVar20);
              goto LAB_0011436e;
            }
            iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 2]);
            if (iVar4 == 0) {
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar15->_M_local_buf + (uVar20 - 1));
              goto LAB_0011436e;
            }
            iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 3]);
            if (iVar4 == 0) {
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar15->_M_local_buf + (uVar20 - 2));
              goto LAB_0011436e;
            }
            iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 4]);
            if (iVar4 == 0) {
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar15->_M_local_buf + (uVar20 - 3));
              goto LAB_0011436e;
            }
            uVar20 = uVar20 - 4;
            lVar6 = lVar6 + -1;
          } while (1 < lVar6);
        }
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar15->_M_local_buf + uVar7);
        lVar6 = (long)paVar14 - (long)paVar15;
        if (lVar6 == 1) {
LAB_00114338:
          iVar4 = isspace((int)paVar14->_M_local_buf[-1]);
          paVar10 = paVar14;
          if (iVar4 != 0) {
            paVar10 = paVar15;
          }
        }
        else if (lVar6 == 2) {
LAB_00114325:
          iVar4 = isspace((int)paVar14->_M_local_buf[-1]);
          paVar10 = paVar14;
          if (iVar4 != 0) {
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar14->_M_local_buf + -1);
            goto LAB_00114338;
          }
        }
        else {
          paVar10 = paVar15;
          if ((lVar6 == 3) &&
             (iVar4 = isspace((int)paVar14->_M_local_buf[-1]), paVar10 = paVar14, iVar4 != 0)) {
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar14->_M_local_buf + -1);
            goto LAB_00114325;
          }
        }
LAB_0011436e:
        local_440._M_string_length = (long)paVar10 - (long)paVar15;
        paVar10->_M_local_buf[0] = '\0';
        if (local_3d8 == &local_3c8) {
          local_440.field_2._8_8_ = local_3c8._8_8_;
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        }
        else {
          local_440._M_dataplus._M_p = (pointer)local_3d8;
        }
        local_440.field_2._M_allocated_capacity._1_7_ = local_3c8._M_allocated_capacity._1_7_;
        local_440.field_2._M_local_buf[0] = local_3c8._M_local_buf[0];
        local_3d0 = 0;
        local_3c8._M_local_buf[0] = '\0';
        local_3d8 = &local_3c8;
        std::__cxx11::string::operator=((string *)&local_3b8,(string *)&local_440);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p);
        }
        if (local_3d8 != &local_3c8) {
          operator_delete(local_3d8);
        }
      }
      paVar15 = &local_440.field_2;
      if ((local_3b0 != 0) && (*local_3b8 != '#')) {
        cVar3 = (char)&local_3b8;
        if (*local_3b8 == '[') {
          lVar6 = std::__cxx11::string::find(cVar3,0x5d);
          if (lVar6 == -1) {
            puVar19 = local_2a0;
            local_2b0 = puVar19;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"inifile","");
            local_440._M_dataplus._M_p = (pointer)paVar15;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_440,local_2b0,local_2b0 + local_2a8);
            iVar4 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
            if (iVar4 != 0) goto LAB_00115256;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_440._M_dataplus._M_p,local_440._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != paVar15) {
              operator_delete(local_440._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"invalid file, unclosed group at line ",0x25);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            DebugStream::~DebugStream((DebugStream *)&local_378);
            puVar13 = local_2b0;
LAB_001151ec:
            if (puVar13 != puVar19) {
              operator_delete(puVar13);
            }
            goto LAB_001151f6;
          }
          std::__cxx11::string::substr((ulong)&local_3f8,(ulong)&local_3b8);
          paVar10 = local_3f8;
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3f8->_M_local_buf + local_3f0);
          paVar14 = local_3f8;
          if (0 < (long)local_3f0 >> 2) {
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_3f8->_M_local_buf + (local_3f0 & 0xfffffffffffffffc));
            lVar6 = ((long)local_3f0 >> 2) + 1;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_3f8->_M_local_buf + 3);
            do {
              iVar4 = isspace((int)paVar17->_M_local_buf[-3]);
              if (iVar4 == 0) {
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar17->_M_local_buf + -3);
                goto LAB_00114792;
              }
              iVar4 = isspace((int)paVar17->_M_local_buf[-2]);
              if (iVar4 == 0) {
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar17->_M_local_buf + -2);
                goto LAB_00114792;
              }
              iVar4 = isspace((int)paVar17->_M_local_buf[-1]);
              if (iVar4 == 0) {
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar17->_M_local_buf + -1);
                goto LAB_00114792;
              }
              iVar4 = isspace((int)paVar17->_M_local_buf[0]);
              if (iVar4 == 0) goto LAB_00114792;
              lVar6 = lVar6 + -1;
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar17->_M_local_buf + 4);
            } while (1 < lVar6);
          }
          lVar6 = (long)paVar15 - (long)paVar14->_M_local_buf;
          if (lVar6 == 1) {
LAB_0011452b:
            iVar4 = isspace((int)paVar14->_M_local_buf[0]);
            paVar17 = paVar14;
            if (iVar4 != 0) {
              paVar17 = paVar15;
            }
LAB_00114792:
            if (paVar15 == paVar17) goto LAB_001147ab;
            std::__cxx11::string::_M_erase((ulong)&local_3f8,0);
          }
          else {
            if (lVar6 == 2) {
LAB_0011451a:
              iVar4 = isspace((int)paVar14->_M_local_buf[0]);
              paVar17 = paVar14;
              if (iVar4 != 0) {
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar14->_M_local_buf + 1);
                goto LAB_0011452b;
              }
              goto LAB_00114792;
            }
            if (lVar6 == 3) {
              iVar4 = isspace((int)paVar14->_M_local_buf[0]);
              paVar17 = paVar14;
              if (iVar4 != 0) {
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar14->_M_local_buf + 1);
                goto LAB_0011451a;
              }
              goto LAB_00114792;
            }
LAB_001147ab:
            local_3f0 = 0;
            paVar10->_M_local_buf[0] = '\0';
          }
          paVar15 = local_3f8;
          uVar7 = local_3f0;
          if (0 < (long)local_3f0 >> 2) {
            uVar7 = (ulong)((uint)local_3f0 & 3);
            lVar6 = ((long)local_3f0 >> 2) + 1;
            uVar20 = local_3f0;
            do {
              iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 1]);
              if (iVar4 == 0) {
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar15->_M_local_buf + uVar20);
                goto LAB_00114a25;
              }
              iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 2]);
              if (iVar4 == 0) {
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar15->_M_local_buf + (uVar20 - 1));
                goto LAB_00114a25;
              }
              iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 3]);
              if (iVar4 == 0) {
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar15->_M_local_buf + (uVar20 - 2));
                goto LAB_00114a25;
              }
              iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 4]);
              if (iVar4 == 0) {
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar15->_M_local_buf + (uVar20 - 3));
                goto LAB_00114a25;
              }
              uVar20 = uVar20 - 4;
              lVar6 = lVar6 + -1;
            } while (1 < lVar6);
          }
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar15->_M_local_buf + uVar7);
          lVar6 = (long)paVar14 - (long)paVar15;
          if (lVar6 == 1) {
LAB_00114886:
            iVar4 = isspace((int)paVar14->_M_local_buf[-1]);
            paVar10 = paVar14;
            if (iVar4 != 0) {
              paVar10 = paVar15;
            }
          }
          else if (lVar6 == 2) {
LAB_0011486f:
            iVar4 = isspace((int)paVar14->_M_local_buf[-1]);
            paVar10 = paVar14;
            if (iVar4 != 0) {
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar14->_M_local_buf + -1);
              goto LAB_00114886;
            }
          }
          else {
            paVar10 = paVar15;
            if ((lVar6 == 3) &&
               (iVar4 = isspace((int)paVar14->_M_local_buf[-1]), paVar10 = paVar14, iVar4 != 0)) {
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar14->_M_local_buf + -1);
              goto LAB_0011486f;
            }
          }
LAB_00114a25:
          local_440._M_string_length = (long)paVar10 - (long)paVar15;
          paVar10->_M_local_buf[0] = '\0';
          if (local_3f8 == &local_3e8) {
            local_440.field_2._8_8_ = local_3e8._8_8_;
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          }
          else {
            local_440._M_dataplus._M_p = (pointer)local_3f8;
          }
          local_440.field_2._M_allocated_capacity._1_7_ = local_3e8._M_allocated_capacity._1_7_;
          local_440.field_2._M_local_buf[0] = local_3e8._M_local_buf[0];
          local_3f0 = 0;
          local_3e8._M_local_buf[0] = '\0';
          local_3f8 = &local_3e8;
          std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_440);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p);
          }
          _Var12._M_p = (pointer)local_3f8;
          if (local_3f8 == &local_3e8) goto LAB_001140fe;
        }
        else {
          lVar6 = std::__cxx11::string::find(cVar3,0x3d);
          if (lVar6 == -1) {
            puVar19 = local_2c0;
            local_2d0 = puVar19;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"inifile","");
            local_440._M_dataplus._M_p = (pointer)paVar15;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_440,local_2d0,local_2d0 + local_2c8);
            iVar4 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
            if (iVar4 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_440._M_dataplus._M_p,local_440._M_string_length
                        );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p != paVar15) {
                operator_delete(local_440._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"invalid file, missing = at line ",0x20);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              DebugStream::~DebugStream((DebugStream *)&local_378);
              puVar13 = local_2d0;
              goto LAB_001151ec;
            }
            goto LAB_0011525d;
          }
          std::__cxx11::string::substr((ulong)&local_338,(ulong)&local_3b8);
          local_358[0] = local_348;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"%20","");
          paVar15 = &local_408;
          local_318 = local_308;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_318," ","");
          uVar7 = 0;
          while (uVar7 = std::__cxx11::string::find((char *)&local_338,(ulong)local_358[0],uVar7),
                uVar20 = local_330, uVar7 != 0xffffffffffffffff) {
            std::__cxx11::string::erase((ulong)&local_338,uVar7);
            std::__cxx11::string::replace((ulong)&local_338,uVar7,(char *)0x0,(ulong)local_318);
            uVar7 = uVar7 + local_310;
          }
          if (local_338 == &local_328) {
            local_408._M_allocated_capacity =
                 CONCAT71(local_328._M_allocated_capacity._1_7_,local_328._M_local_buf[0]);
            local_408._8_8_ = local_328._8_8_;
          }
          else {
            local_408._M_allocated_capacity =
                 CONCAT71(local_328._M_allocated_capacity._1_7_,local_328._M_local_buf[0]);
            paVar15 = local_338;
          }
          local_410 = local_330;
          local_338 = &local_328;
          local_330 = 0;
          local_328._M_local_buf[0] = '\0';
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar15->_M_local_buf + uVar20);
          paVar14 = paVar15;
          local_418 = paVar15;
          if (0 < (long)uVar20 >> 2) {
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar15->_M_local_buf + (uVar20 & 0xfffffffffffffffc));
            lVar6 = ((long)uVar20 >> 2) + 1;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar15->_M_local_buf + 3);
            local_420 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar15->_M_local_buf + uVar20);
            do {
              iVar4 = isspace((int)paVar17->_M_local_buf[-3]);
              if (iVar4 == 0) {
                paVar10 = local_420;
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar17->_M_local_buf + -3);
                goto LAB_001148f3;
              }
              iVar4 = isspace((int)paVar17->_M_local_buf[-2]);
              if (iVar4 == 0) {
                paVar10 = local_420;
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar17->_M_local_buf + -2);
                goto LAB_001148f3;
              }
              iVar4 = isspace((int)paVar17->_M_local_buf[-1]);
              if (iVar4 == 0) {
                paVar10 = local_420;
                paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar17->_M_local_buf + -1);
                goto LAB_001148f3;
              }
              iVar4 = isspace((int)paVar17->_M_local_buf[0]);
              paVar10 = local_420;
              if (iVar4 == 0) goto LAB_001148f3;
              lVar6 = lVar6 + -1;
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar17->_M_local_buf + 4);
            } while (1 < lVar6);
          }
          lVar6 = (long)paVar10 - (long)paVar14->_M_local_buf;
          if (lVar6 == 1) {
LAB_001148e1:
            iVar4 = isspace((int)paVar14->_M_local_buf[0]);
            paVar17 = paVar14;
            if (iVar4 != 0) {
              paVar17 = paVar10;
            }
LAB_001148f3:
            if (paVar10 == paVar17) goto LAB_0011490c;
            std::__cxx11::string::_M_erase((ulong)&local_418,0);
          }
          else {
            if (lVar6 == 2) {
LAB_001148cc:
              iVar4 = isspace((int)paVar14->_M_local_buf[0]);
              paVar17 = paVar14;
              if (iVar4 != 0) {
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar14->_M_local_buf + 1);
                goto LAB_001148e1;
              }
              goto LAB_001148f3;
            }
            if (lVar6 == 3) {
              iVar4 = isspace((int)paVar14->_M_local_buf[0]);
              paVar17 = paVar14;
              if (iVar4 != 0) {
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar14->_M_local_buf + 1);
                goto LAB_001148cc;
              }
              goto LAB_001148f3;
            }
LAB_0011490c:
            local_410 = 0;
            paVar15->_M_local_buf[0] = '\0';
          }
          paVar15 = local_418;
          uVar7 = local_410;
          if (0 < (long)local_410 >> 2) {
            uVar7 = (ulong)((uint)local_410 & 3);
            lVar6 = ((long)local_410 >> 2) + 1;
            uVar20 = local_410;
            do {
              iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 1]);
              if (iVar4 == 0) {
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar15->_M_local_buf + uVar20);
                goto LAB_00114ace;
              }
              iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 2]);
              if (iVar4 == 0) {
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar15->_M_local_buf + (uVar20 - 1));
                goto LAB_00114ace;
              }
              iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 3]);
              if (iVar4 == 0) {
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar15->_M_local_buf + (uVar20 - 2));
                goto LAB_00114ace;
              }
              iVar4 = isspace((int)paVar15->_M_local_buf[uVar20 - 4]);
              if (iVar4 == 0) {
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar15->_M_local_buf + (uVar20 - 3));
                goto LAB_00114ace;
              }
              uVar20 = uVar20 - 4;
              lVar6 = lVar6 + -1;
            } while (1 < lVar6);
          }
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar15->_M_local_buf + uVar7);
          lVar6 = (long)paVar14 - (long)paVar15;
          if (lVar6 == 1) {
LAB_001149e3:
            iVar4 = isspace((int)paVar14->_M_local_buf[-1]);
            paVar10 = paVar14;
            if (iVar4 != 0) {
              paVar10 = paVar15;
            }
          }
          else if (lVar6 == 2) {
LAB_001149cc:
            iVar4 = isspace((int)paVar14->_M_local_buf[-1]);
            paVar10 = paVar14;
            if (iVar4 != 0) {
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar14->_M_local_buf + -1);
              goto LAB_001149e3;
            }
          }
          else {
            paVar10 = paVar15;
            if ((lVar6 == 3) &&
               (iVar4 = isspace((int)paVar14->_M_local_buf[-1]), paVar10 = paVar14, iVar4 != 0)) {
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar14->_M_local_buf + -1);
              goto LAB_001149cc;
            }
          }
LAB_00114ace:
          local_440._M_string_length = (long)paVar10 - (long)paVar15;
          paVar10->_M_local_buf[0] = '\0';
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          if (local_418 == &local_408) {
            local_440.field_2._8_8_ = local_408._8_8_;
          }
          else {
            local_440._M_dataplus._M_p = (pointer)local_418;
          }
          local_440.field_2._M_allocated_capacity = local_408._M_allocated_capacity;
          local_410 = 0;
          local_408._M_allocated_capacity = local_408._M_allocated_capacity & 0xffffffffffffff00;
          local_418 = &local_408;
          if (local_318 != local_308) {
            operator_delete(local_318);
          }
          if (local_358[0] != local_348) {
            operator_delete(local_358[0]);
          }
          if (local_338 != &local_328) {
            operator_delete(local_338);
          }
          std::__cxx11::string::substr((ulong)&local_398,(ulong)&local_3b8);
          pcVar21 = local_398;
          pcVar1 = local_398 + local_390;
          pcVar16 = local_398;
          if (0 < (long)local_390 >> 2) {
            pcVar16 = local_398 + (local_390 & 0xfffffffffffffffc);
            lVar6 = ((long)local_390 >> 2) + 1;
            pcVar18 = local_398 + 3;
            do {
              iVar4 = isspace((int)pcVar18[-3]);
              if (iVar4 == 0) {
                pcVar18 = pcVar18 + -3;
                goto LAB_00114c78;
              }
              iVar4 = isspace((int)pcVar18[-2]);
              if (iVar4 == 0) {
                pcVar18 = pcVar18 + -2;
                goto LAB_00114c78;
              }
              iVar4 = isspace((int)pcVar18[-1]);
              if (iVar4 == 0) {
                pcVar18 = pcVar18 + -1;
                goto LAB_00114c78;
              }
              iVar4 = isspace((int)*pcVar18);
              if (iVar4 == 0) goto LAB_00114c78;
              lVar6 = lVar6 + -1;
              pcVar18 = pcVar18 + 4;
            } while (1 < lVar6);
          }
          lVar6 = (long)pcVar1 - (long)pcVar16;
          if (lVar6 == 1) {
LAB_00114c54:
            iVar4 = isspace((int)*pcVar16);
            pcVar18 = pcVar16;
            if (iVar4 != 0) {
              pcVar18 = pcVar1;
            }
LAB_00114c78:
            if (pcVar1 == pcVar18) goto LAB_00114c94;
            std::__cxx11::string::_M_erase((ulong)&local_398,0);
          }
          else {
            if (lVar6 == 2) {
LAB_00114c43:
              iVar4 = isspace((int)*pcVar16);
              pcVar18 = pcVar16;
              if (iVar4 != 0) {
                pcVar16 = pcVar16 + 1;
                goto LAB_00114c54;
              }
              goto LAB_00114c78;
            }
            if (lVar6 == 3) {
              iVar4 = isspace((int)*pcVar16);
              pcVar18 = pcVar16;
              if (iVar4 != 0) {
                pcVar16 = pcVar16 + 1;
                goto LAB_00114c43;
              }
              goto LAB_00114c78;
            }
LAB_00114c94:
            local_390 = 0;
            *pcVar21 = '\0';
          }
          pcVar1 = local_398;
          uVar7 = local_390;
          if (0 < (long)local_390 >> 2) {
            uVar7 = (ulong)((uint)local_390 & 3);
            lVar6 = ((long)local_390 >> 2) + 1;
            uVar20 = local_390;
            do {
              iVar4 = isspace((int)pcVar1[uVar20 - 1]);
              if (iVar4 == 0) {
                pcVar21 = pcVar1 + uVar20;
                goto LAB_00114da6;
              }
              iVar4 = isspace((int)pcVar1[uVar20 - 2]);
              if (iVar4 == 0) {
                pcVar21 = pcVar1 + (uVar20 - 1);
                goto LAB_00114da6;
              }
              iVar4 = isspace((int)pcVar1[uVar20 - 3]);
              if (iVar4 == 0) {
                pcVar21 = pcVar1 + (uVar20 - 2);
                goto LAB_00114da6;
              }
              iVar4 = isspace((int)pcVar1[uVar20 - 4]);
              if (iVar4 == 0) {
                pcVar21 = pcVar1 + (uVar20 - 3);
                goto LAB_00114da6;
              }
              uVar20 = uVar20 - 4;
              lVar6 = lVar6 + -1;
            } while (1 < lVar6);
          }
          pcVar16 = pcVar1 + uVar7;
          lVar6 = (long)pcVar16 - (long)pcVar1;
          if (lVar6 == 1) {
LAB_00114d70:
            iVar4 = isspace((int)pcVar16[-1]);
            pcVar21 = pcVar16;
            if (iVar4 != 0) {
              pcVar21 = pcVar1;
            }
          }
          else if (lVar6 == 2) {
LAB_00114d5d:
            iVar4 = isspace((int)pcVar16[-1]);
            pcVar21 = pcVar16;
            if (iVar4 != 0) {
              pcVar16 = pcVar16 + -1;
              goto LAB_00114d70;
            }
          }
          else {
            pcVar21 = pcVar1;
            if ((lVar6 == 3) && (iVar4 = isspace((int)pcVar16[-1]), pcVar21 = pcVar16, iVar4 != 0))
            {
              pcVar16 = pcVar16 + -1;
              goto LAB_00114d5d;
            }
          }
LAB_00114da6:
          *pcVar21 = '\0';
          local_378 = &local_368;
          if (local_398 == &local_388) {
            uStack_360 = uStack_380;
          }
          else {
            local_378 = local_398;
          }
          _local_368 = CONCAT71(uStack_387,local_388);
          local_390 = 0;
          local_388 = '\0';
          local_398 = &local_388;
          local_370 = (long)pcVar21 - (long)pcVar1;
          iVar4 = std::__cxx11::string::compare((char *)&local_440);
          if ((iVar4 != 0) &&
             (iVar4 = std::__cxx11::string::compare((char *)&local_378), iVar4 != 0)) {
            this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[](local_2f8,&local_2f0);
            pmVar8 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[](this_00,&local_440);
            std::__cxx11::string::_M_assign((string *)pmVar8);
          }
          if (local_378 != &local_368) {
            operator_delete(local_378);
          }
          _Var12._M_p = local_440._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p == &local_440.field_2) goto LAB_001140fe;
        }
        operator_delete(_Var12._M_p);
      }
      goto LAB_001140fe;
    }
LAB_001151f6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    uVar11 = local_420._0_1_;
    if (local_3b8 != local_3a8) {
      operator_delete(local_3b8);
    }
  }
  std::ifstream::~ifstream(local_238);
  return (bool)uVar11;
}

Assistant:

bool IniFile::readFile(std::string filename)
{
    std::ifstream file;
    wordexp_t exp_res;
    wordexp(filename.c_str(), &exp_res, 0);
    file.open(exp_res.we_wordv[0]);
    wordfree(&exp_res);

    if (!file.is_open()) {
        debug("inifile") << "unable to open file" << filename;
        return 1;
    }

    std::string line;
    std::string group;
    size_t linenum = 0;

    while (std::getline(file, line)) {
        linenum++;
        size_t commentStart = line.find("//");

        if (commentStart != std::string::npos) {
            line = trim(line.substr(0, commentStart));
        }

        if (line.length() == 0 || line.front() == '#') {
            continue;
        }

        if (line[0] == '[') {
            size_t end = line.find(']');

            if (end == std::string::npos) {
                debug("inifile") << "invalid file, unclosed group at line " << linenum;
                return false;
            }

            group = trim(line.substr(1, end - 1));
            continue;
        }

        size_t nameEnd = line.find('=');

        if (nameEnd == std::string::npos) {
            debug("inifile") << "invalid file, missing = at line " << linenum;
            return false;
        }

        std::string name = trim(string_replace(line.substr(0, nameEnd), "%20", " "));
        std::string value = trim(line.substr(nameEnd + 1));

        if (name == "" || value == "") {
            continue;
        }

        m_values[group][name] = value;
    }

    return true;
}